

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::IODeclaration::checkDataTypesValid<soul::CodeLocation&>
          (IODeclaration *this,CodeLocation *errorLocation)

{
  undefined1 uVar1;
  Primitive PVar2;
  Structure *o;
  bool bVar3;
  pointer pTVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string local_188;
  string local_168;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if (this->endpointType == stream) {
    pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar4 != 0x18) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,"Multiple data types not supported by this endpoint type");
      CodeLocation::throwError(errorLocation,&local_68);
    }
    uVar1 = pTVar4->category;
    PVar2 = (pTVar4->primitiveType).type;
    o = (pTVar4->structure).object;
    if (o != (Structure *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    if (1 < (byte)(uVar1 - 1)) {
      CompileMessageHelpers::createMessage<>
                (&local_d8,syntax,error,"Only primitives or vectors supported by this endpoint type"
                );
      CodeLocation::throwError(errorLocation,&local_d8);
    }
    if (PVar2 == void_) {
      CompileMessageHelpers::createMessage<>
                (&local_110,syntax,error,"void is not a valid endpoint type");
      CodeLocation::throwError(errorLocation,&local_110);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(o);
  }
  pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pTVar4 == (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (1 < (ulong)(((long)(this->dataTypes).
                             super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->dataTypes).
                             super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        uVar5 = 1;
        do {
          lVar7 = 0;
          uVar6 = uVar5;
          do {
            pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            bVar3 = Type::isEqual(pTVar4 + uVar5,(Type *)(&pTVar4->category + lVar7),4);
            if (bVar3) {
              Type::getDescription_abi_cxx11_
                        (&local_168,
                         (Type *)(&((this->dataTypes).
                                    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->category + lVar7));
              Type::getDescription_abi_cxx11_
                        (&local_188,
                         (this->dataTypes).
                         super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar5);
              CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                        (&local_148,(CompileMessageHelpers *)0x1,none,0x2ad320,(char *)&local_168,
                         &local_188,in_stack_fffffffffffffe68);
              CodeLocation::throwError(errorLocation,&local_148);
            }
            lVar7 = lVar7 + 0x18;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)(((long)(this->dataTypes).
                                        super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->dataTypes).
                                        super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x5555555555555555));
      }
      return;
    }
    if ((pTVar4->primitiveType).type == void_) break;
    pTVar4 = pTVar4 + 1;
  }
  CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"void is not a valid endpoint type")
  ;
  CodeLocation::throwError(errorLocation,&local_a0);
}

Assistant:

void checkDataTypesValid (Thrower&& errorLocation)
        {
            if (isStreamEndpoint())
            {
                if (dataTypes.size() != 1)
                    errorLocation.throwError (Errors::noMultipleTypesOnEndpoint());

                auto dataType = dataTypes.front();

                if (! dataType.isPrimitiveOrVector())
                    errorLocation.throwError (Errors::illegalTypeForEndpoint());

                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());
            }

            for (auto& dataType : dataTypes)
                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());

            for (size_t i = 1; i < dataTypes.size(); ++i)
                for (size_t j = 0; j < i; ++j)
                    if (dataTypes[i].isEqual (dataTypes[j], Type::ignoreVectorSize1))
                        errorLocation.throwError (Errors::duplicateTypesInList (dataTypes[j].getDescription(),
                                                                                dataTypes[i].getDescription()));
        }